

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O3

Vec_Vec_t * Cgt_ManDecideSimple(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  Aig_Obj_t *pCand;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Vec_t *p;
  void **ppvVar5;
  void *pvVar6;
  Ssw_Sml_t *p_00;
  uint uVar7;
  long lVar8;
  Aig_Obj_t *Entry;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  timespec ts;
  uint local_84;
  long local_70;
  timespec local_58;
  Aig_Man_t *local_48;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  iVar1 = clock_gettime(3,&local_58);
  if (iVar1 < 0) {
    local_70 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_70 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  uVar2 = pAig->nRegs;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar2 - 1) {
    uVar7 = uVar2;
  }
  p->nCap = uVar7;
  if (uVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar7 << 3);
  }
  p->pArray = ppvVar5;
  if (0 < (int)uVar2) {
    uVar11 = 0;
    do {
      pvVar6 = calloc(1,0x10);
      ppvVar5[uVar11] = pvVar6;
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  p->nSize = uVar2;
  local_84 = 0;
  p_00 = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  if (0 < pAig->nRegs) {
    lVar8 = 0;
    local_84 = 0;
    local_48 = pAig;
    do {
      iVar1 = (int)lVar8;
      uVar2 = pAig->nTruePos + iVar1;
      if (((((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) ||
          (uVar7 = pAig->nTruePis + iVar1, (int)uVar7 < 0)) || (pAig->vCis->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (vGatesAll->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar6 = vGatesAll->pArray[lVar8];
      if (0 < *(int *)((long)pvVar6 + 4)) {
        local_38 = (Aig_Obj_t *)pAig->vCos->pArray[uVar2];
        local_40 = (Aig_Obj_t *)pAig->vCis->pArray[uVar7];
        lVar10 = 0;
        Entry = (Aig_Obj_t *)0x0;
        iVar9 = 0;
        do {
          pCand = *(Aig_Obj_t **)(*(long *)((long)pvVar6 + 8) + lVar10 * 8);
          if ((nOdcMax == 0) &&
             (iVar3 = Ssw_SmlCheckXorImplication(p_00,local_38,local_40,pCand), iVar3 == 0)) {
            puts("Clock gate candidate is invalid!");
          }
          iVar4 = Ssw_SmlNodeCountOnesReal(p_00,pCand);
          pAig = local_48;
          iVar3 = iVar9;
          if (iVar9 <= iVar4) {
            iVar3 = iVar4;
          }
          if (iVar9 < iVar4) {
            Entry = pCand;
          }
          lVar10 = lVar10 + 1;
          iVar9 = iVar3;
        } while (lVar10 < *(int *)((long)pvVar6 + 4));
        if (Entry != (Aig_Obj_t *)0x0) {
          Vec_VecPush(p,iVar1,Entry);
          local_84 = local_84 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pAig->nRegs);
  }
  Ssw_SmlStop(p_00);
  if (fVerbose != 0) {
    if ((long)vGatesAll->nSize < 1) {
      uVar11 = 0;
    }
    else {
      lVar8 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)vGatesAll->pArray[lVar8] + 4));
        lVar8 = lVar8 + 1;
      } while (vGatesAll->nSize != lVar8);
    }
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",uVar11,(ulong)local_84,
           (ulong)(uint)pAig->nRegs);
    fVar12 = Cgt_ManComputeCoverage(pAig,p);
    iVar1 = 0x8e2bcb;
    printf("Gated transitions = %5.2f %%. ",(double)fVar12);
    Abc_Print(iVar1,"%s =","Time");
    iVar9 = 3;
    iVar1 = clock_gettime(3,&local_58);
    if (iVar1 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar8 + local_70) / 1000000.0);
  }
  return p;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideSimple( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObjLi, * pObjLo, * pCand, * pCandBest;
    int i, k, nHitsCur, nHitsMax, Counter = 0;
    abctime clk = Abc_Clock();
    int nTransTotal = 0, nTransSaved = 0;
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        nHitsMax = 0;
        pCandBest = NULL;
        vCands = Vec_VecEntry( vGatesAll, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pCand, k )
        {
            // check if this is indeed a clock-gate
            if ( nOdcMax == 0 && !Ssw_SmlCheckXorImplication( pSml, pObjLi, pObjLo, pCand ) )
                printf( "Clock gate candidate is invalid!\n" );
            // find its characteristic number
            nHitsCur = Ssw_SmlNodeCountOnesReal( pSml, pCand );
            if ( nHitsMax < nHitsCur )
            {
                nHitsMax = nHitsCur;
                pCandBest = pCand;
            }
        }
        if ( pCandBest != NULL )
        {
            Vec_VecPush( vGates, i, pCandBest );
            Counter++;
            nTransSaved += nHitsMax;
        }
        nTransTotal += 32 * nFrames * nWords;
    }
    Ssw_SmlStop( pSml );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
//        printf( "Gated transitions = %5.2f %%. (%5.2f %%.) ", 
//            100.0*nTransSaved/nTransTotal, Cgt_ManComputeCoverage(pAig, vGates) );
        printf( "Gated transitions = %5.2f %%. ", Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
/*
    {
        Vec_Ptr_t * vCompletes;
        vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
        printf( "Complete gates = %d. \n", Vec_PtrSize(vCompletes) );
        Vec_PtrFree( vCompletes );
    }
*/
    return vGates;
}